

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vs_wrapper.hpp
# Opt level: O3

void __thiscall
VSInterface::VSInDelegator::Read
          (VSInDelegator *this,char *name,vector<long,_std::allocator<long>_> *output)

{
  iterator __position;
  int iVar1;
  int64_t in_RAX;
  int iVar2;
  int64_t local_38;
  
  local_38 = in_RAX;
  iVar1 = (*this->_vsapi->propNumElements)(this->_in,name);
  if (-1 < iVar1) {
    if (*(long *)(output + 8) != *(long *)output) {
      *(long *)(output + 8) = *(long *)output;
    }
    if (iVar1 != 0) {
      iVar2 = 0;
      do {
        local_38 = (*this->_vsapi->propGetInt)(this->_in,name,iVar2,&this->_err);
        __position._M_current = *(long **)(output + 8);
        if (__position._M_current == *(long **)(output + 0x10)) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (output,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          *(long **)(output + 8) = __position._M_current + 1;
        }
        iVar2 = iVar2 + 1;
      } while (iVar1 != iVar2);
    }
  }
  return;
}

Assistant:

void Read(const char* name, std::vector<int64_t>& output) override {
      auto size = _vsapi->propNumElements(_in, name);
      if (size < 0) return;
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(_vsapi->propGetInt(_in, name, i, &_err));
    }